

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_rwkv_wkv6(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  void *__s;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  long lVar31;
  int64_t i;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int local_140;
  int local_138;
  void *local_118;
  
  if (dst->src[0]->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1fb5,"fatal error");
  }
  pgVar4 = dst->src[1];
  lVar5 = dst->ne[0];
  lVar6 = pgVar4->ne[1];
  uVar14 = lVar5 / lVar6;
  lVar38 = (long)params->ith;
  if (lVar38 < lVar6) {
    iVar3 = params->nth;
    lVar15 = ((lVar38 + 1) * lVar6) / (long)iVar3;
    if (lVar6 <= lVar15) {
      lVar15 = lVar6;
    }
    if (lVar5 % lVar6 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1f12,"GGML_ASSERT(%s) failed","C % HEADS == 0");
    }
    pvVar7 = dst->src[0]->data;
    uVar8 = pgVar4->ne[2];
    pvVar25 = pgVar4->data;
    __s = dst->data;
    lVar9 = dst->src[5]->ne[1];
    pvVar10 = dst->src[3]->data;
    pvVar11 = dst->src[2]->data;
    pvVar12 = dst->src[4]->data;
    if (params->ith == 0) {
      memset(__s,0,lVar5 * uVar8 * 4);
    }
    ggml_barrier(params->threadpool);
    uVar16 = (long)uVar14 / 0x10;
    local_138 = (int)((lVar6 * lVar38) / (long)iVar3);
    lVar26 = (long)local_138;
    lVar28 = uVar14 * uVar14 * 4;
    lVar21 = uVar14 * uVar14 * lVar26;
    local_140 = (int)lVar15;
    lVar15 = uVar14 * lVar26;
    local_118 = (void *)((long)__s + lVar15 * 4);
    pvVar30 = (void *)((long)pvVar25 + lVar15 * 4);
    lVar38 = uVar16 * 0x40 + lVar21 * 4;
    lVar15 = uVar16 * 0x40 + lVar15 * 4;
    lVar35 = (long)pvVar25 + lVar15;
    lVar15 = (long)__s + lVar15;
    lVar1 = uVar14 * 4;
    lVar2 = lVar6 * uVar14 * 4;
    for (uVar20 = 0; uVar20 != (~((long)uVar8 >> 0x3f) & uVar8); uVar20 = uVar20 + 1) {
      lVar17 = (long)uVar8 / lVar9;
      lVar18 = (long)uVar20 / lVar17;
      lVar32 = uVar14 * lVar5 * lVar18;
      if ((long)uVar20 % lVar17 == 0) {
        pvVar25 = (void *)(lVar32 * 4 + (long)dst->src[5]->data);
      }
      else {
        pvVar25 = (void *)((long)__s + lVar32 * 4 + lVar5 * uVar8 * 4);
      }
      lVar18 = (lVar18 * lVar1 + uVar8 * 4) * lVar5;
      lVar17 = (long)__s + lVar18 + lVar21 * 4;
      lVar22 = (long)__s + lVar18 + lVar38;
      pvVar37 = (void *)((long)pvVar25 + lVar21 * 4);
      lVar33 = (long)pvVar25 + lVar38;
      lVar32 = lVar15;
      pvVar25 = local_118;
      pvVar29 = pvVar30;
      lVar31 = lVar35;
      for (lVar18 = lVar26; lVar18 < local_140; lVar18 = lVar18 + 1) {
        lVar19 = lVar33;
        lVar23 = lVar22;
        pvVar36 = pvVar37;
        lVar39 = lVar17;
        for (uVar34 = 0; uVar34 != (~((long)uVar14 >> 0x3f) & uVar14); uVar34 = uVar34 + 1) {
          lVar24 = uVar34 + lVar18 * uVar14 + lVar6 * uVar14 * uVar20;
          auVar41 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar7 + lVar24 * 4)));
          auVar42 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar11 + lVar24 * 4)));
          auVar43 = vbroadcastss_avx512f
                              (ZEXT416(*(uint *)((long)pvVar10 + uVar34 * 4 + lVar18 * uVar14 * 4)))
          ;
          auVar44 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar12 + lVar24 * 4)));
          lVar24 = 0;
          uVar27 = ~((long)uVar16 >> 0x3f) & uVar16;
          while (bVar40 = uVar27 != 0, uVar27 = uVar27 - 1, bVar40) {
            auVar45 = vmulps_avx512f(auVar41,*(undefined1 (*) [64])((long)pvVar29 + lVar24));
            auVar46 = vfmadd213ps_avx512f(auVar43,auVar45,
                                          *(undefined1 (*) [64])((long)pvVar36 + lVar24));
            auVar46 = vfmadd213ps_avx512f(auVar46,auVar42,
                                          *(undefined1 (*) [64])((long)pvVar25 + lVar24));
            auVar45 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pvVar36 + lVar24),auVar44,
                                          auVar45);
            *(undefined1 (*) [64])((long)pvVar25 + lVar24) = auVar46;
            *(undefined1 (*) [64])(lVar39 + lVar24) = auVar45;
            lVar24 = lVar24 + 0x40;
          }
          for (lVar24 = 0; (long)(uVar16 * 0x10 + lVar24) < (long)uVar14; lVar24 = lVar24 + 1) {
            auVar47 = ZEXT416((uint)(auVar41._0_4_ * *(float *)(lVar31 + lVar24 * 4)));
            auVar48 = ZEXT416(*(uint *)(lVar19 + lVar24 * 4));
            auVar13 = vfmadd213ss_fma(auVar43._0_16_,auVar47,auVar48);
            auVar13 = vfmadd213ss_fma(auVar13,auVar42._0_16_,ZEXT416(*(uint *)(lVar32 + lVar24 * 4))
                                     );
            auVar47 = vfmadd213ss_fma(auVar48,auVar44._0_16_,auVar47);
            *(int *)(lVar32 + lVar24 * 4) = auVar13._0_4_;
            *(int *)(lVar23 + lVar24 * 4) = auVar47._0_4_;
          }
          lVar39 = lVar39 + lVar1;
          pvVar36 = (void *)((long)pvVar36 + lVar1);
          lVar23 = lVar23 + lVar1;
          lVar19 = lVar19 + lVar1;
        }
        pvVar25 = (void *)((long)pvVar25 + lVar1);
        pvVar29 = (void *)((long)pvVar29 + lVar1);
        lVar32 = lVar32 + lVar1;
        lVar31 = lVar31 + lVar1;
        lVar17 = lVar17 + lVar28;
        pvVar37 = (void *)((long)pvVar37 + lVar28);
        lVar22 = lVar22 + lVar28;
        lVar33 = lVar33 + lVar28;
      }
      local_118 = (void *)((long)local_118 + lVar2);
      pvVar30 = (void *)((long)pvVar30 + lVar2);
      lVar15 = lVar15 + lVar2;
      lVar35 = lVar35 + lVar2;
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_rwkv_wkv6(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_rwkv_wkv6_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}